

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O0

ProgramSources * __thiscall
deqp::gles31::Functional::anon_unknown_1::ProgramLogCase::getProgramSources
          (ProgramSources *__return_storage_ptr__,ProgramLogCase *this)

{
  ProgramSources *pPVar1;
  uint *code;
  string local_678;
  ShaderSource local_658;
  string local_630;
  ShaderSource local_610;
  string local_5e8;
  ShaderSource local_5c8;
  string local_5a0;
  ShaderSource local_580;
  ProgramSources local_558;
  string local_488;
  ShaderSource local_468;
  string local_440;
  ShaderSource local_420;
  string local_3f8;
  ShaderSource local_3d8;
  ProgramSources local_3b0;
  string local_2e0;
  ShaderSource local_2c0;
  ProgramSources local_298;
  string local_1c8;
  ShaderSource local_1a8;
  string local_170;
  ShaderSource local_150;
  ProgramSources local_128;
  char *local_58;
  char *tessEvalTemplate1;
  char *tessCtrlTemplate1;
  char *geometryTemplate1;
  char *computeTemplate1;
  char *fragmentTemplate2;
  char *fragmentTemplate1;
  char *vertexTemplate2;
  char *vertexTemplate1;
  ProgramLogCase *this_local;
  
  vertexTemplate2 =
       "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
  ;
  fragmentTemplate1 =
       "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nvoid main()\n{\n\tgl_Position = a_pos;\n}\n";
  fragmentTemplate2 =
       "${GLSL_VERSION_DECL}\nin highp vec4 v_missingVar;\nuniform highp int u_uniform;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = v_missingVar + vec4(float(u_uniform));\n}\n"
  ;
  computeTemplate1 =
       "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = vec4(1.0);\n}\n"
  ;
  geometryTemplate1 =
       "${GLSL_VERSION_DECL}\nlayout (binding = 0) buffer IOBuffer { highp float buf_var; };\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tbuf_var = u_uniform.x;\n}\n"
  ;
  tessCtrlTemplate1 =
       "${GLSL_VERSION_DECL}\n${GEOMETRY_SHADER_REQUIRE}\nlayout(triangles) in;\nlayout(max_vertices=1, points) out;\nin highp vec4 v_missingVar[];\nuniform highp int u_uniform;\nvoid main()\n{\n\tgl_Position = gl_in[0].gl_Position + v_missingVar[2] + vec4(float(u_uniform));\n\tEmitVertex();\n}\n"
  ;
  tessEvalTemplate1 =
       "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices=2) out;patch out highp vec2 vp_var;\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position\n\tgl_TessLevelOuter[0] = 0.8;\n\tgl_TessLevelOuter[1] = 0.8;\n\tif (gl_InvocationID == 0)\n\t\tvp_var = gl_in[gl_InvocationID].gl_Position.xy;\n}\n"
  ;
  local_58 = 
  "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(isolines) in;in highp float vp_var[];\nvoid main()\n{\n\tgl_Position = gl_in[gl_InvocationID].gl_Position + vec4(vp_var[1]);\n}\n"
  ;
  code = &switchD_021e85b0::switchdataD_02c1a234;
  vertexTemplate1 = (char *)this;
  this_local = (ProgramLogCase *)__return_storage_ptr__;
  switch(this->m_buildErrorType) {
  case BUILDERROR_VERTEX_FRAGMENT:
    glu::ProgramSources::ProgramSources(&local_128);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_170,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
               ,(char *)code);
    glu::VertexSource::VertexSource((VertexSource *)&local_150,&local_170);
    pPVar1 = glu::ProgramSources::operator<<(&local_128,&local_150);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_1c8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 v_missingVar;\nuniform highp int u_uniform;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = v_missingVar + vec4(float(u_uniform));\n}\n"
               ,(char *)code);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_1a8,&local_1c8);
    pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_1a8);
    glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar1);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    glu::VertexSource::~VertexSource((VertexSource *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    glu::ProgramSources::~ProgramSources(&local_128);
    break;
  case BUILDERROR_COMPUTE:
    glu::ProgramSources::ProgramSources(&local_298);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2e0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout (binding = 0) buffer IOBuffer { highp float buf_var; };\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tbuf_var = u_uniform.x;\n}\n"
               ,(char *)code);
    glu::ComputeSource::ComputeSource((ComputeSource *)&local_2c0,&local_2e0);
    pPVar1 = glu::ProgramSources::operator<<(&local_298,&local_2c0);
    glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar1);
    glu::ComputeSource::~ComputeSource((ComputeSource *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    glu::ProgramSources::~ProgramSources(&local_298);
    break;
  case BUILDERROR_GEOMETRY:
    glu::ProgramSources::ProgramSources(&local_3b0);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_3f8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
               ,(char *)code);
    glu::VertexSource::VertexSource((VertexSource *)&local_3d8,&local_3f8);
    pPVar1 = glu::ProgramSources::operator<<(&local_3b0,&local_3d8);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_440,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${GEOMETRY_SHADER_REQUIRE}\nlayout(triangles) in;\nlayout(max_vertices=1, points) out;\nin highp vec4 v_missingVar[];\nuniform highp int u_uniform;\nvoid main()\n{\n\tgl_Position = gl_in[0].gl_Position + v_missingVar[2] + vec4(float(u_uniform));\n\tEmitVertex();\n}\n"
               ,(char *)code);
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_420,&local_440);
    pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_420);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_488,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = vec4(1.0);\n}\n"
               ,(char *)code);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_468,&local_488);
    pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_468);
    glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar1);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    glu::VertexSource::~VertexSource((VertexSource *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    glu::ProgramSources::~ProgramSources(&local_3b0);
    break;
  case BUILDERROR_TESSELLATION:
    glu::ProgramSources::ProgramSources(&local_558);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_5a0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nin highp vec4 a_pos;\nvoid main()\n{\n\tgl_Position = a_pos;\n}\n"
               ,(char *)code);
    glu::VertexSource::VertexSource((VertexSource *)&local_580,&local_5a0);
    pPVar1 = glu::ProgramSources::operator<<(&local_558,&local_580);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_5e8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices=2) out;patch out highp vec2 vp_var;\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position\n\tgl_TessLevelOuter[0] = 0.8;\n\tgl_TessLevelOuter[1] = 0.8;\n\tif (gl_InvocationID == 0)\n\t\tvp_var = gl_in[gl_InvocationID].gl_Position.xy;\n}\n"
               ,(char *)code);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_5c8,&local_5e8);
    pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_5c8);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_630,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(isolines) in;in highp float vp_var[];\nvoid main()\n{\n\tgl_Position = gl_in[gl_InvocationID].gl_Position + vec4(vp_var[1]);\n}\n"
               ,(char *)code);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_610,&local_630);
    pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_610);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_678,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main()\n{\n\tfragColor = vec4(1.0);\n}\n"
               ,(char *)code);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_658,&local_678);
    pPVar1 = glu::ProgramSources::operator<<(pPVar1,&local_658);
    glu::ProgramSources::ProgramSources(__return_storage_ptr__,pPVar1);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_658);
    std::__cxx11::string::~string((string *)&local_678);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_610);
    std::__cxx11::string::~string((string *)&local_630);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5e8);
    glu::VertexSource::~VertexSource((VertexSource *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    glu::ProgramSources::~ProgramSources(&local_558);
    break;
  default:
    glu::ProgramSources::ProgramSources(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

glu::ProgramSources ProgramLogCase::getProgramSources (void) const
{
	const char* const	vertexTemplate1 =	"${GLSL_VERSION_DECL}\n"
											"in highp vec4 a_pos;\n"
											"uniform highp vec4 u_uniform;\n"
											"void main()\n"
											"{\n"
											"	gl_Position = a_pos + u_uniform;\n"
											"}\n";
	const char* const	vertexTemplate2 =	"${GLSL_VERSION_DECL}\n"
											"in highp vec4 a_pos;\n"
											"void main()\n"
											"{\n"
											"	gl_Position = a_pos;\n"
											"}\n";
	const char* const	fragmentTemplate1 =	"${GLSL_VERSION_DECL}\n"
											"in highp vec4 v_missingVar;\n"
											"uniform highp int u_uniform;\n"
											"layout(location = 0) out mediump vec4 fragColor;\n"
											"void main()\n"
											"{\n"
											"	fragColor = v_missingVar + vec4(float(u_uniform));\n"
											"}\n";

	const char* const	fragmentTemplate2 =	"${GLSL_VERSION_DECL}\n"
											"layout(location = 0) out mediump vec4 fragColor;\n"
											"void main()\n"
											"{\n"
											"	fragColor = vec4(1.0);\n"
											"}\n";
	const char* const	computeTemplate1 =	"${GLSL_VERSION_DECL}\n"
											"layout (binding = 0) buffer IOBuffer { highp float buf_var; };\n"
											"uniform highp vec4 u_uniform;\n"
											"void main()\n"
											"{\n"
											"	buf_var = u_uniform.x;\n"
											"}\n";
	const char* const	geometryTemplate1 =	"${GLSL_VERSION_DECL}\n"
											"${GEOMETRY_SHADER_REQUIRE}\n"
											"layout(triangles) in;\n"
											"layout(max_vertices=1, points) out;\n"
											"in highp vec4 v_missingVar[];\n"
											"uniform highp int u_uniform;\n"
											"void main()\n"
											"{\n"
											"	gl_Position = gl_in[0].gl_Position + v_missingVar[2] + vec4(float(u_uniform));\n"
											"	EmitVertex();\n"
											"}\n";
	const char* const	tessCtrlTemplate1 =	"${GLSL_VERSION_DECL}\n"
											"${TESSELLATION_SHADER_REQUIRE}\n"
											"layout(vertices=2) out;"
											"patch out highp vec2 vp_var;\n"
											"void main()\n"
											"{\n"
											"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position\n"
											"	gl_TessLevelOuter[0] = 0.8;\n"
											"	gl_TessLevelOuter[1] = 0.8;\n"
											"	if (gl_InvocationID == 0)\n"
											"		vp_var = gl_in[gl_InvocationID].gl_Position.xy;\n"
											"}\n";
	const char* const	tessEvalTemplate1 =	"${GLSL_VERSION_DECL}\n"
											"${TESSELLATION_SHADER_REQUIRE}\n"
											"layout(isolines) in;"
											"in highp float vp_var[];\n"
											"void main()\n"
											"{\n"
											"	gl_Position = gl_in[gl_InvocationID].gl_Position + vec4(vp_var[1]);\n"
											"}\n";

	switch (m_buildErrorType)
	{
		case BUILDERROR_VERTEX_FRAGMENT:
			return glu::ProgramSources()
					<< glu::VertexSource(specializeShader(m_context, vertexTemplate1))
					<< glu::FragmentSource(specializeShader(m_context, fragmentTemplate1));

		case BUILDERROR_COMPUTE:
			return glu::ProgramSources()
					<< glu::ComputeSource(specializeShader(m_context, computeTemplate1));

		case BUILDERROR_GEOMETRY:
			return glu::ProgramSources()
					<< glu::VertexSource(specializeShader(m_context, vertexTemplate1))
					<< glu::GeometrySource(specializeShader(m_context, geometryTemplate1))
					<< glu::FragmentSource(specializeShader(m_context, fragmentTemplate2));

		case BUILDERROR_TESSELLATION:
			return glu::ProgramSources()
					<< glu::VertexSource(specializeShader(m_context, vertexTemplate2))
					<< glu::TessellationControlSource(specializeShader(m_context, tessCtrlTemplate1))
					<< glu::TessellationEvaluationSource(specializeShader(m_context, tessEvalTemplate1))
					<< glu::FragmentSource(specializeShader(m_context, fragmentTemplate2));

		default:
			DE_ASSERT(false);
			return glu::ProgramSources();
	}
}